

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_inst.h
# Opt level: O2

void __thiscall mocker::ir::Reg::~Reg(Reg *this)

{
  ~Reg(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

explicit Reg(std::string identifier) : identifier(std::move(identifier)) {}